

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O3

genxStatus addAttribute(genxAttribute_conflict a,constUtf8 valuestr)

{
  collector *c;
  genxWriter w;
  constUtf8 __src;
  uint uVar1;
  genxStatus gVar2;
  uint uVar3;
  int iVar4;
  size_t __n;
  ulong uVar5;
  long lVar6;
  constUtf8 local_38;
  
  w = a->writer;
  local_38 = valuestr;
  if (valuestr != (constUtf8)0x0) {
    c = &a->value;
    (a->value).used = 0;
    uVar5 = 0;
    if (*valuestr != '\0') {
      do {
        __src = local_38;
        iVar4 = (int)uVar5;
        uVar1 = genxNextUnicodeChar(&local_38);
        if (uVar1 == 0xffffffff) {
          w->status = GENX_BAD_UTF8;
          return GENX_BAD_UTF8;
        }
        if ((int)uVar1 < 0) {
LAB_001d6724:
          w->status = GENX_NON_XML_CHARACTER;
          return GENX_NON_XML_CHARACTER;
        }
        if (uVar1 < 0x10000) {
          uVar3 = (uint)w->xmlChars[uVar1];
        }
        else {
          uVar3 = (uint)(uVar1 < 0x110000);
        }
        if (uVar3 == 0) goto LAB_001d6724;
        if ((int)uVar1 < 0x22) {
          if (uVar1 == 9) {
            if ((a->value).space <= iVar4 + 5) {
              gVar2 = growCollector(w,c,iVar4 + 5);
              w->status = gVar2;
              if (gVar2 != GENX_SUCCESS) {
                return gVar2;
              }
              iVar4 = (a->value).used;
            }
            builtin_memcpy((a->value).buf + iVar4,"&#x9;",5);
          }
          else if (uVar1 == 10) {
            if ((a->value).space <= iVar4 + 5) {
              gVar2 = growCollector(w,c,iVar4 + 5);
              w->status = gVar2;
              if (gVar2 != GENX_SUCCESS) {
                return gVar2;
              }
              iVar4 = (a->value).used;
            }
            builtin_memcpy((a->value).buf + iVar4,"&#xA;",5);
          }
          else {
            if (uVar1 != 0xd) {
LAB_001d6616:
              lVar6 = (long)iVar4;
              __n = (long)local_38 - (long)__src;
              if ((long)(a->value).space <= (long)(lVar6 + __n)) {
                gVar2 = growCollector(w,c,(int)(lVar6 + __n));
                w->status = gVar2;
                if (gVar2 != GENX_SUCCESS) {
                  return gVar2;
                }
                lVar6 = (long)(a->value).used;
              }
              strncpy((char *)((a->value).buf + lVar6),(char *)__src,__n);
              uVar5 = (ulong)(uint)((int)__n + (a->value).used);
              goto LAB_001d66d1;
            }
            if ((a->value).space <= iVar4 + 5) {
              gVar2 = growCollector(w,c,iVar4 + 5);
              w->status = gVar2;
              if (gVar2 != GENX_SUCCESS) {
                return gVar2;
              }
              iVar4 = (a->value).used;
            }
            builtin_memcpy((a->value).buf + iVar4,"&#xD;",5);
          }
LAB_001d66ca:
          uVar5 = (ulong)((a->value).used + 5);
        }
        else if (uVar1 == 0x22) {
          if ((a->value).space <= iVar4 + 6) {
            gVar2 = growCollector(w,c,iVar4 + 6);
            w->status = gVar2;
            if (gVar2 != GENX_SUCCESS) {
              return gVar2;
            }
            iVar4 = (a->value).used;
          }
          builtin_memcpy((a->value).buf + iVar4,"&quot;",6);
          uVar5 = (ulong)((a->value).used + 6);
        }
        else {
          if (uVar1 == 0x26) {
            if ((a->value).space <= iVar4 + 5) {
              gVar2 = growCollector(w,c,iVar4 + 5);
              w->status = gVar2;
              if (gVar2 != GENX_SUCCESS) {
                return gVar2;
              }
              iVar4 = (a->value).used;
            }
            builtin_memcpy((a->value).buf + iVar4,"&amp;",5);
            goto LAB_001d66ca;
          }
          if (uVar1 != 0x3c) goto LAB_001d6616;
          if ((a->value).space <= iVar4 + 4) {
            gVar2 = growCollector(w,c,iVar4 + 4);
            w->status = gVar2;
            if (gVar2 != GENX_SUCCESS) {
              return gVar2;
            }
            iVar4 = (a->value).used;
          }
          builtin_memcpy((a->value).buf + iVar4,"&lt;",4);
          uVar5 = (ulong)((a->value).used + 4);
        }
LAB_001d66d1:
        (a->value).used = (int)uVar5;
      } while (*local_38 != '\0');
      uVar5 = (ulong)(int)uVar5;
    }
    c->buf[uVar5] = '\0';
  }
  if (a->ns != (genxNamespace)0x0) {
    addNamespace(a->ns,(utf8)0x0);
  }
  if ((valuestr == (constUtf8)0x0) || (a->provided == 0)) {
    a->provided = 1;
    gVar2 = GENX_SUCCESS;
  }
  else {
    w->status = GENX_DUPLICATE_ATTRIBUTE;
    gVar2 = GENX_DUPLICATE_ATTRIBUTE;
  }
  return gVar2;
}

Assistant:

static genxStatus addAttribute(genxAttribute a, constUtf8 valuestr)
{
  utf8 lastv = (utf8) valuestr;
  genxWriter w = a->writer;

  /* if valuestr not provided, this is an xmlns with a pre-cooked value */
  if (valuestr)
  {
    startCollect(&a->value);
    while (*valuestr)
    {
      int c = genxNextUnicodeChar(&valuestr);
      
      if (c == -1)
	return w->status = GENX_BAD_UTF8;
      
      if (!isXMLChar(w, c))
	return w->status = GENX_NON_XML_CHARACTER;
      
      switch(c)
      {
      case 9:
	collectPiece(w, &a->value, "&#x9;", 5);
	break;
      case 0xa:
	collectPiece(w, &a->value, "&#xA;", 5); 
	break;
      case 0xd:
	collectPiece(w, &a->value, "&#xD;", 5); 
	break;
      case '"':
	collectPiece(w, &a->value, "&quot;", 6);
	break;
      case '<':
	collectPiece(w, &a->value, "&lt;", 4);
	break;
      case '&':
	collectPiece(w, &a->value, "&amp;", 5);
	break;
	/*
      case '>':
	collectPiece(w, &a->value, "&gt;", 4);
	break;
	*/
      default:
	collectPiece(w, &a->value, (const char *) lastv, valuestr - lastv);
	break;
      }
      lastv = (utf8) valuestr;
    }
    endCollect(&a->value);
  }

  /* now add the namespace attribute; might fail if it's bee hand-declared */
  if (a->ns)
    addNamespace(a->ns, NULL);

  if (valuestr && a->provided)
    return w->status = GENX_DUPLICATE_ATTRIBUTE;
  a->provided = 1;

  return GENX_SUCCESS;
}